

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O0

void __thiscall Simulator::push_real(Simulator *this,PCode *code)

{
  bool bVar1;
  string *psVar2;
  Symbol *pSVar3;
  double *value;
  StackSymbol local_148;
  undefined1 local_100 [8];
  Symbol symbol;
  double local_68;
  StackSymbol local_60;
  PCode *local_18;
  PCode *code_local;
  Simulator *this_local;
  
  local_18 = code;
  code_local = (PCode *)this;
  psVar2 = PCode::first_abi_cxx11_(code);
  bVar1 = Recognition::is_real(psVar2);
  if (bVar1) {
    psVar2 = PCode::first_abi_cxx11_(local_18);
    local_68 = std::__cxx11::stod(psVar2,(size_t *)0x0);
    StackSymbol::StackSymbol(&local_60,&local_68);
    std::deque<StackSymbol,_std::allocator<StackSymbol>_>::push_back(&this->stack_,&local_60);
    StackSymbol::~StackSymbol(&local_60);
  }
  else {
    psVar2 = PCode::first_abi_cxx11_(local_18);
    pSVar3 = ScopeTree::resolve(&this->tree_,psVar2);
    Symbol::Symbol((Symbol *)local_100,pSVar3);
    value = Symbol::real_value((Symbol *)local_100);
    StackSymbol::StackSymbol(&local_148,value);
    std::deque<StackSymbol,_std::allocator<StackSymbol>_>::push_back(&this->stack_,&local_148);
    StackSymbol::~StackSymbol(&local_148);
    Symbol::~Symbol((Symbol *)local_100);
  }
  inc_eip(this);
  return;
}

Assistant:

void Simulator::push_real(const PCode &code) {
    if (Recognition::is_real(code.first())) {
        stack_.push_back(StackSymbol(std::stod(code.first())));
    } else {
        Symbol symbol = tree_.resolve(code.first());
        stack_.push_back(StackSymbol(symbol.real_value()));
    }
    inc_eip();
}